

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cc
# Opt level: O1

uintb __thiscall FloatFormat::convertEncoding(FloatFormat *this,uintb encoding,FloatFormat *formin)

{
  uint uVar1;
  int iVar2;
  uintb uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = 1L << ((byte)formin->signbit_pos & 0x3f);
  uVar6 = (encoding >> ((byte)formin->frac_pos & 0x3f)) << (-(char)formin->frac_size & 0x3fU);
  uVar1 = (uint)(encoding >> ((byte)formin->exp_pos & 0x3f)) &
          ~(uint)(-1L << ((byte)formin->exp_size & 0x3f));
  if (formin->maxexponent == uVar1) {
    iVar2 = this->maxexponent;
  }
  else {
    iVar2 = (uVar1 - formin->bias) + this->bias;
    if (iVar2 < 0) {
      uVar3 = 1L << ((byte)this->signbit_pos & 0x3f);
      if ((uVar5 & encoding) == 0) {
        uVar3 = 0;
      }
      return uVar3;
    }
    if (this->maxexponent < iVar2) {
      uVar6 = 1L << ((byte)this->signbit_pos & 0x3f);
      if ((uVar5 & encoding) == 0) {
        uVar6 = 0;
      }
      return uVar6 | (long)this->maxexponent << ((byte)this->exp_pos & 0x3f);
    }
  }
  if ((this->jbitimplied == true) && (formin->jbitimplied == false)) {
    uVar6 = uVar6 * 2;
  }
  else if ((this->jbitimplied == false) && (formin->jbitimplied != false)) {
    uVar6 = uVar6 >> 1 | 0x8000000000000000;
  }
  uVar4 = 1L << ((byte)this->signbit_pos & 0x3f);
  if ((uVar5 & encoding) == 0) {
    uVar4 = 0;
  }
  return uVar4 | (long)iVar2 << ((byte)this->exp_pos & 0x3f) |
         (uVar6 >> (-(char)this->frac_size & 0x3fU)) << ((byte)this->frac_pos & 0x3f);
}

Assistant:

bool FloatFormat::extractSign(uintb x) const

{
  x >>= signbit_pos;
  return ((x&1)!=0);
}